

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O0

void __thiscall
pico_tree::
kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
::search_nearest<pico_tree::point<float,2ul>,search_nn_counter<pico_tree::neighbor<int,float>>>
          (kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
           *this,point<float,_2UL> *x,search_nn_counter<pico_tree::neighbor<int,_float>_> *visitor)

{
  undefined8 in_RDX;
  point_type *in_RSI;
  kd_tree<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_RDI;
  point_wrapper<pico_tree::point<float,_2UL>_> p;
  point_wrapper<pico_tree::point<float,_2UL>_> local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  internal::point_wrapper<pico_tree::point<float,_2UL>_>::point_wrapper(&local_20,in_RSI);
  search_nearest<pico_tree::internal::point_wrapper<pico_tree::point<float,2ul>>,search_nn_counter<pico_tree::neighbor<int,float>>>
            (in_RDI,local_20.point_,local_18);
  return;
}

Assistant:

inline void search_nearest(P_ const& x, V_& visitor) const {
    static_assert(
        std::is_same_v<
            scalar_type,
            typename internal::point_wrapper<P_>::scalar_type>,
        "POINT_AND_TREE_SCALAR_TYPES_DIFFER");
    static_assert(
        dim == internal::point_wrapper<P_>::dim || dim == dynamic_extent ||
            internal::point_wrapper<P_>::dim == dynamic_extent,
        "POINT_AND_TREE_DIMS_DIFFER");

    internal::point_wrapper<P_> p(x);
    search_nearest(p, visitor, typename Metric_::space_category());
  }